

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.h
# Opt level: O2

string * __thiscall
warhawk::common::cookie::to_string_abi_cxx11_(string *__return_storage_ptr__,cookie *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::operator+(__return_storage_ptr__,&this->m_domain,"\t");
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::operator+(&local_60,&this->m_path,"\t");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::to_string(&local_40,this->m_expires);
  std::operator+(&local_60,&local_40,"\t");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator+(&local_60,&this->m_name,"\t");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( ) const
  {
    std::string res = m_domain + "\t";
    res += m_include_sub ? "TRUE\t" : "FALSE\t";
    res += m_path + "\t";
    res += m_secure ? "TRUE\t" : "FALSE\t";
    res += std::to_string( m_expires ) + "\t";
    res += m_name + "\t";
    res += m_value;
    return res;
  }